

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSleepCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestSleepCommand::InitialPass
          (cmCTestSleepCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  uint secondsToWait;
  int iVar3;
  uint uVar4;
  uint secondsToWait_00;
  long lVar5;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,&local_40);
  }
  else {
    secondsToWait = atoi((pbVar1->_M_dataplus)._M_p);
    lVar5 = (long)pbVar2 - (long)pbVar1 >> 5;
    if (lVar5 == 3) {
      iVar3 = atoi(pbVar1[1]._M_dataplus._M_p);
      uVar4 = atoi(pbVar1[2]._M_dataplus._M_p);
      secondsToWait_00 = (iVar3 + secondsToWait) - uVar4;
      if (iVar3 + secondsToWait < uVar4 || secondsToWait_00 == 0) {
        return true;
      }
      cmCTestScriptHandler::SleepInSeconds(secondsToWait_00);
      cmCTestScriptHandler::UpdateElapsedTime((this->super_cmCTestCommand).CTestScriptHandler);
      return true;
    }
    if (lVar5 == 1) {
      cmCTestScriptHandler::SleepInSeconds(secondsToWait);
      cmCTestScriptHandler::UpdateElapsedTime((this->super_cmCTestCommand).CTestScriptHandler);
      return true;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmCTestSleepCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // sleep for specified seconds
  unsigned int time1 = atoi(args[0].c_str());
  if (args.size() == 1) {
    cmCTestScriptHandler::SleepInSeconds(time1);
    // update the elapsed time since it could have slept for a while
    this->CTestScriptHandler->UpdateElapsedTime();
    return true;
  }

  // sleep up to a duration
  if (args.size() == 3) {
    unsigned int duration = atoi(args[1].c_str());
    unsigned int time2 = atoi(args[2].c_str());
    if (time1 + duration > time2) {
      duration = (time1 + duration - time2);
      cmCTestScriptHandler::SleepInSeconds(duration);
      // update the elapsed time since it could have slept for a while
      this->CTestScriptHandler->UpdateElapsedTime();
    }
    return true;
  }

  this->SetError("called with incorrect number of arguments");
  return false;
}